

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg-val-cmp.cpp
# Opt level: O1

void doubles(void)

{
  rtosc_cmp_options very_tolerant;
  
  r[0].type = 'd';
  l[0].type = 'd';
  l[0].val.s = (char *)0x419d6f34587e6b75;
  r[0].val.s = (char *)0x419d6f3454000000;
  cmp_gt(l,r,1,1,(rtosc_cmp_options *)0x0,"larger double value","smaller double value",0x7c);
  r[0].type = 'd';
  l[0].type = 'd';
  l[0].val.h = 0x3ff0000000000000;
  r[0].val.s = (char *)0xbff0000000000000;
  cmp_gt(l,r,1,1,(rtosc_cmp_options *)0x0,"1.0","-1.0",0x82);
  very_tolerant.float_tolerance = 2.0;
  cmp_1(2,l,r,1,1,&very_tolerant,"1.0","-1.0 (2.0 tolerance)",0x87);
  cmp_1(2,r,l,1,1,&very_tolerant,"-1.0","1.0 (2.0 tolerance)",0x89);
  return;
}

Assistant:

void doubles()
{
    l[0].type = r[0].type = 'd';
    l[0].val.d = 123456790.123456789;
    r[0].val.d = 123456789.0;

    cmp_gt(l, r, 1, 1, NULL,
           "larger double value", "smaller double value", __LINE__);

    l[0].type = r[0].type = 'd';
    l[0].val.d = 1.0f;
    r[0].val.d = -1.0f;

    cmp_gt(l, r, 1, 1, NULL, "1.0", "-1.0", __LINE__);

    rtosc_cmp_options very_tolerant = { 2.0 };

    cmp_1(eq, l, r, 1, 1, &very_tolerant,
          "1.0", "-1.0 (2.0 tolerance)", __LINE__);
    cmp_1(eq, r, l, 1, 1, &very_tolerant,
          "-1.0", "1.0 (2.0 tolerance)", __LINE__);
}